

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_Error FT_Stream_ReadFields(FT_Stream stream,FT_Frame_Field *fields,void *structure)

{
  uchar **ppuVar1;
  uint *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  FT_Byte FVar7;
  bool bVar8;
  int iVar9;
  FT_Error FVar10;
  ulong uVar11;
  sbyte sVar12;
  ushort uVar13;
  uint uVar14;
  ulong uVar15;
  uint *__src;
  
  if (fields == (FT_Frame_Field *)0x0) {
    FVar10 = 6;
  }
  else if (stream == (FT_Stream)0x0) {
    FVar10 = 0x28;
  }
  else {
    ppuVar1 = &stream->cursor;
    __src = (uint *)stream->cursor;
    FVar10 = 0;
    bVar8 = false;
    do {
      bVar3 = fields->value;
      switch(bVar3) {
      case 4:
        FVar10 = FT_Stream_EnterFrame(stream,(ulong)fields->offset);
        if (FVar10 == 0) {
          __src = (uint *)*ppuVar1;
          fields = fields + 1;
          iVar9 = 3;
          bVar8 = true;
          FVar10 = 0;
        }
        else {
          iVar9 = 5;
        }
        break;
      default:
        *ppuVar1 = (uchar *)__src;
        iVar9 = 5;
        break;
      case 8:
      case 9:
        uVar15 = (ulong)(byte)*__src;
        __src = (uint *)((long)__src + 1);
        sVar12 = 0x18;
        goto LAB_001f18d7;
      case 0xc:
      case 0xd:
        uVar13 = (ushort)*__src << 8 | (ushort)*__src >> 8;
        goto LAB_001f1895;
      case 0xe:
      case 0xf:
        uVar13 = (ushort)*__src;
LAB_001f1895:
        uVar15 = (ulong)uVar13;
        __src = (uint *)((long)__src + 2);
        sVar12 = 0x10;
LAB_001f18d7:
        uVar11 = (long)(((int)uVar15 << sVar12) >> sVar12);
        if ((bVar3 & 1) == 0) {
          uVar11 = uVar15;
        }
        uVar15 = (ulong)fields->offset;
        FVar7 = fields->size;
        if (FVar7 == '\x04') {
          *(int *)((long)structure + uVar15) = (int)uVar11;
        }
        else if (FVar7 == '\x02') {
          *(short *)((long)structure + uVar15) = (short)uVar11;
        }
        else if (FVar7 == '\x01') {
          *(char *)((long)structure + uVar15) = (char)uVar11;
        }
        else {
          *(ulong *)((long)structure + uVar15) = uVar11;
        }
        fields = fields + 1;
        iVar9 = 0;
        break;
      case 0x10:
      case 0x11:
        uVar14 = *__src;
        uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
        ;
        goto LAB_001f18b0;
      case 0x12:
      case 0x13:
        uVar14 = *__src;
LAB_001f18b0:
        uVar15 = (ulong)uVar14;
        __src = __src + 1;
        sVar12 = 0;
        goto LAB_001f18d7;
      case 0x14:
      case 0x15:
        bVar5 = (byte)*__src;
        bVar6 = *(byte *)((long)__src + 1);
        bVar4 = *(byte *)((long)__src + 2);
        goto LAB_001f18c3;
      case 0x16:
      case 0x17:
        bVar5 = *(byte *)((long)__src + 2);
        bVar6 = *(byte *)((long)__src + 1);
        bVar4 = (byte)*__src;
LAB_001f18c3:
        __src = (uint *)((long)__src + 3);
        uVar15 = (ulong)bVar4 | (ulong)((uint)bVar6 << 8 | (uint)bVar5 << 0x10);
        sVar12 = 8;
        goto LAB_001f18d7;
      case 0x18:
      case 0x19:
        puVar2 = (uint *)((ulong)fields->size + (long)__src);
        if (stream->limit < puVar2) {
          iVar9 = 5;
          FVar10 = 0x55;
        }
        else {
          if (bVar3 == 0x18) {
            memcpy((void *)((ulong)fields->offset + (long)structure),__src,(ulong)fields->size);
          }
          fields = fields + 1;
          iVar9 = 3;
          __src = puVar2;
        }
      }
    } while ((iVar9 == 0) || (iVar9 == 3));
    if ((iVar9 == 5) && (bVar8)) {
      if (stream->read != (FT_Stream_IoFunc)0x0) {
        if (stream->base != (uchar *)0x0) {
          (*stream->memory->free)(stream->memory,stream->base);
        }
        stream->base = (uchar *)0x0;
      }
      *ppuVar1 = (uchar *)0x0;
      stream->limit = (uchar *)0x0;
    }
  }
  return FVar10;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_ReadFields( FT_Stream              stream,
                        const FT_Frame_Field*  fields,
                        void*                  structure )
  {
    FT_Error  error;
    FT_Bool   frame_accessed = 0;
    FT_Byte*  cursor;


    if ( !fields )
      return FT_THROW( Invalid_Argument );

    if ( !stream )
      return FT_THROW( Invalid_Stream_Handle );

    cursor = stream->cursor;

    error = FT_Err_Ok;
    do
    {
      FT_ULong  value;
      FT_Int    sign_shift;
      FT_Byte*  p;


      switch ( fields->value )
      {
      case ft_frame_start:  /* access a new frame */
        error = FT_Stream_EnterFrame( stream, fields->offset );
        if ( error )
          goto Exit;

        frame_accessed = 1;
        cursor         = stream->cursor;
        fields++;
        continue;  /* loop! */

      case ft_frame_bytes:  /* read a byte sequence */
      case ft_frame_skip:   /* skip some bytes      */
        {
          FT_UInt  len = fields->size;


          if ( cursor + len > stream->limit )
          {
            error = FT_THROW( Invalid_Stream_Operation );
            goto Exit;
          }

          if ( fields->value == ft_frame_bytes )
          {
            p = (FT_Byte*)structure + fields->offset;
            FT_MEM_COPY( p, cursor, len );
          }
          cursor += len;
          fields++;
          continue;
        }

      case ft_frame_byte:
      case ft_frame_schar:  /* read a single byte */
        value = FT_NEXT_BYTE( cursor );
        sign_shift = 24;
        break;

      case ft_frame_short_be:
      case ft_frame_ushort_be:  /* read a 2-byte big-endian short */
        value = FT_NEXT_USHORT( cursor );
        sign_shift = 16;
        break;

      case ft_frame_short_le:
      case ft_frame_ushort_le:  /* read a 2-byte little-endian short */
        value = FT_NEXT_USHORT_LE( cursor );
        sign_shift = 16;
        break;

      case ft_frame_long_be:
      case ft_frame_ulong_be:  /* read a 4-byte big-endian long */
        value = FT_NEXT_ULONG( cursor );
        sign_shift = 0;
        break;

      case ft_frame_long_le:
      case ft_frame_ulong_le:  /* read a 4-byte little-endian long */
        value = FT_NEXT_ULONG_LE( cursor );
        sign_shift = 0;
        break;

      case ft_frame_off3_be:
      case ft_frame_uoff3_be:  /* read a 3-byte big-endian long */
        value = FT_NEXT_UOFF3( cursor );
        sign_shift = 8;
        break;

      case ft_frame_off3_le:
      case ft_frame_uoff3_le:  /* read a 3-byte little-endian long */
        value = FT_NEXT_UOFF3_LE( cursor );
        sign_shift = 8;
        break;

      default:
        /* otherwise, exit the loop */
        stream->cursor = cursor;
        goto Exit;
      }

      /* now, compute the signed value is necessary */
      if ( fields->value & FT_FRAME_OP_SIGNED )
        value = (FT_ULong)( (FT_Int32)( value << sign_shift ) >> sign_shift );

      /* finally, store the value in the object */

      p = (FT_Byte*)structure + fields->offset;
      switch ( fields->size )
      {
      case ( 8 / FT_CHAR_BIT ):
        *(FT_Byte*)p = (FT_Byte)value;
        break;

      case ( 16 / FT_CHAR_BIT ):
        *(FT_UShort*)p = (FT_UShort)value;
        break;

      case ( 32 / FT_CHAR_BIT ):
        *(FT_UInt32*)p = (FT_UInt32)value;
        break;

      default:  /* for 64-bit systems */
        *(FT_ULong*)p = (FT_ULong)value;
      }

      /* go to next field */
      fields++;
    }
    while ( 1 );

  Exit:
    /* close the frame if it was opened by this read */
    if ( frame_accessed )
      FT_Stream_ExitFrame( stream );

    return error;
  }